

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

LY_ERR lyd_parse_lyb(ly_ctx *ctx,lysc_ext_instance *ext,lyd_node *parent,lyd_node **first_p,
                    ly_in *in,uint32_t parse_opts,uint32_t val_opts,uint32_t int_opts,ly_set *parsed
                    ,ly_bool *subtree_sibling,lyd_ctx **lydctx_p)

{
  uint32_t parse_options;
  lylyb_ctx *lybctx;
  LY_VECODE code;
  LY_ERR ret__;
  LY_ERR LVar1;
  lyd_ctx *lydctx;
  anon_struct_24_3_37108ca1 *paVar2;
  long *plVar3;
  char *pcVar4;
  lys_module **pplVar5;
  long lVar6;
  ulong uVar7;
  uint local_34;
  
  if ((short)parse_opts != 0) {
    __assert_fail("!(parse_opts & ~LYD_PARSE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                  ,0x690,
                  "LY_ERR lyd_parse_lyb(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if (0xffff < val_opts) {
    __assert_fail("!(val_opts & ~LYD_VALIDATE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                  ,0x691,
                  "LY_ERR lyd_parse_lyb(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if ((parse_opts >> 0x16 & 1) != 0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!(parse_opts & 0x400000)",
           "lyd_parse_lyb");
    return LY_EINVAL;
  }
  if (subtree_sibling != (ly_bool *)0x0) {
    *subtree_sibling = '\0';
  }
  lydctx = (lyd_ctx *)calloc(1,0x1080);
  if (lydctx == (lyd_ctx *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_parse_lyb");
    return LY_EMEM;
  }
  paVar2 = (anon_struct_24_3_37108ca1 *)calloc(1,0x38);
  lydctx->data_ctx = paVar2;
  if (paVar2 == (anon_struct_24_3_37108ca1 *)0x0) {
    pcVar4 = "lyd_parse_lyb";
LAB_00135fac:
    LVar1 = LY_EMEM;
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar4);
  }
  else {
    paVar2->in = in;
    paVar2->ctx = ctx;
    lydctx->parse_opts = parse_opts;
    lydctx->val_opts = val_opts;
    lydctx->int_opts = int_opts;
    lydctx->free = lyd_lyb_ctx_free;
    lydctx->ext = ext;
    LVar1 = lyd_parser_find_operation(parent,int_opts,&lydctx->op_node);
    if (((LVar1 != LY_SUCCESS) ||
        (LVar1 = lyb_parse_magic_number((lylyb_ctx *)lydctx->data_ctx), LVar1 != LY_SUCCESS)) ||
       (LVar1 = lyb_parse_header((lylyb_ctx *)lydctx->data_ctx), LVar1 != LY_SUCCESS))
    goto LAB_00135fb7;
    lybctx = (lylyb_ctx *)lydctx->data_ctx;
    parse_options = lydctx->parse_opts;
    lyb_read_number(&local_34,4,2,lybctx);
    uVar7 = (ulong)local_34;
    if (uVar7 != 0) {
      pplVar5 = lybctx->models;
      if (pplVar5 == (lys_module **)0x0) {
        plVar3 = (long *)calloc(1,uVar7 * 8 + 8);
        if (plVar3 == (long *)0x0) goto LAB_0013613f;
        lVar6 = 0;
      }
      else {
        plVar3 = (long *)realloc(pplVar5 + -1,((long)&pplVar5[-1]->ctx + uVar7) * 8 + 8);
        if (plVar3 == (long *)0x0) {
LAB_0013613f:
          ctx = lybctx->ctx;
          pcVar4 = "lyb_parse_data_models";
          goto LAB_00135fac;
        }
        lVar6 = *plVar3;
      }
      pplVar5 = (lys_module **)(plVar3 + 1);
      lybctx->models = pplVar5;
      memset(plVar3 + lVar6 + 1,0,uVar7 * 8);
      for (lVar6 = 0; uVar7 << 3 != lVar6; lVar6 = lVar6 + 8) {
        LVar1 = lyb_parse_model(lybctx,parse_options,'\x01',(lys_module **)((long)pplVar5 + lVar6));
        if (LVar1 != LY_SUCCESS) goto LAB_00135fb7;
        pplVar5 = lybctx->models;
        pplVar5[-1] = (lys_module *)((long)&pplVar5[-1]->ctx + 1);
      }
    }
    LVar1 = lyb_parse_siblings((lyd_lyb_ctx *)lydctx,parent,first_p,parsed);
    if (LVar1 == LY_SUCCESS) {
      if (((int_opts & 0x40) == 0) || (*lydctx->data_ctx->in->current == '\0')) {
        if (((int_opts & 0xf) == 0) || (lydctx->op_node != (lyd_node *)0x0)) {
          ly_in_skip(lydctx->data_ctx->in,1);
          LVar1 = LY_SUCCESS;
          goto LAB_00135fb7;
        }
        pcVar4 = "Missing the operation node.";
        code = LYVE_DATA;
      }
      else {
        pcVar4 = "Unexpected sibling node.";
        code = LYVE_SYNTAX;
      }
      ly_vlog(ctx,(char *)0x0,code,pcVar4);
      LVar1 = LY_EVALID;
    }
  }
LAB_00135fb7:
  if (((parse_opts >> 0x10 & 1) != 0) &&
     ((((lydctx->node_types).count != 0 || ((lydctx->meta_types).count != 0)) ||
      ((lydctx->node_when).count != 0)))) {
    __assert_fail("!(parse_opts & LYD_PARSE_ONLY) || (!lybctx->node_types.count && !lybctx->meta_types.count && !lybctx->node_when.count)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                  ,0x6ca,
                  "LY_ERR lyd_parse_lyb(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if (LVar1 == LY_SUCCESS) {
    *lydctx_p = lydctx;
    LVar1 = LY_SUCCESS;
  }
  else {
    lyd_lyb_ctx_free(lydctx);
  }
  return LVar1;
}

Assistant:

LY_ERR
lyd_parse_lyb(const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, struct lyd_node *parent,
        struct lyd_node **first_p, struct ly_in *in, uint32_t parse_opts, uint32_t val_opts, uint32_t int_opts,
        struct ly_set *parsed, ly_bool *subtree_sibling, struct lyd_ctx **lydctx_p)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_lyb_ctx *lybctx;

    assert(!(parse_opts & ~LYD_PARSE_OPTS_MASK));
    assert(!(val_opts & ~LYD_VALIDATE_OPTS_MASK));

    LY_CHECK_ARG_RET(ctx, !(parse_opts & LYD_PARSE_SUBTREE), LY_EINVAL);

    if (subtree_sibling) {
        *subtree_sibling = 0;
    }

    lybctx = calloc(1, sizeof *lybctx);
    LY_CHECK_ERR_RET(!lybctx, LOGMEM(ctx), LY_EMEM);
    lybctx->lybctx = calloc(1, sizeof *lybctx->lybctx);
    LY_CHECK_ERR_GOTO(!lybctx->lybctx, LOGMEM(ctx); rc = LY_EMEM, cleanup);

    lybctx->lybctx->in = in;
    lybctx->lybctx->ctx = ctx;
    lybctx->parse_opts = parse_opts;
    lybctx->val_opts = val_opts;
    lybctx->int_opts = int_opts;
    lybctx->free = lyd_lyb_ctx_free;
    lybctx->ext = ext;

    /* find the operation node if it exists already */
    LY_CHECK_GOTO(rc = lyd_parser_find_operation(parent, int_opts, &lybctx->op_node), cleanup);

    /* read magic number */
    rc = lyb_parse_magic_number(lybctx->lybctx);
    LY_CHECK_GOTO(rc, cleanup);

    /* read header */
    rc = lyb_parse_header(lybctx->lybctx);
    LY_CHECK_GOTO(rc, cleanup);

    /* read used models */
    rc = lyb_parse_data_models(lybctx->lybctx, lybctx->parse_opts);
    LY_CHECK_GOTO(rc, cleanup);

    /* read sibling(s) */
    rc = lyb_parse_siblings(lybctx, parent, first_p, parsed);
    LY_CHECK_GOTO(rc, cleanup);

    if ((int_opts & LYD_INTOPT_NO_SIBLINGS) && lybctx->lybctx->in->current[0]) {
        LOGVAL(ctx, LYVE_SYNTAX, "Unexpected sibling node.");
        rc = LY_EVALID;
        goto cleanup;
    }
    if ((int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY)) && !lybctx->op_node) {
        LOGVAL(ctx, LYVE_DATA, "Missing the operation node.");
        rc = LY_EVALID;
        goto cleanup;
    }

    /* read the last zero, parsing finished */
    ly_in_skip(lybctx->lybctx->in, 1);

cleanup:
    /* there should be no unres stored if validation should be skipped */
    assert(!(parse_opts & LYD_PARSE_ONLY) || (!lybctx->node_types.count && !lybctx->meta_types.count &&
            !lybctx->node_when.count));

    if (rc) {
        lyd_lyb_ctx_free((struct lyd_ctx *)lybctx);
    } else {
        *lydctx_p = (struct lyd_ctx *)lybctx;
    }
    return rc;
}